

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Rep *pRVar2;
  key_type *__k;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  LogMessage *pLVar6;
  iterator iVar7;
  mapped_type_conflict1 *pmVar8;
  long *plVar9;
  _Rb_tree_header *p_Var10;
  long *plVar11;
  long lVar12;
  long lVar13;
  void **ppvVar14;
  Result r;
  string err;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  mapped_type_conflict1 local_144;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [2];
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  undefined1 local_a8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  Result::Result((Result *)local_170);
  validateInputCount((Result *)local_140,layer,1,1);
  local_170 = local_140;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_p != local_128) {
    operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
  }
  bVar5 = Result::good((Result *)local_170);
  if (bVar5) {
    validateOutputCount((Result *)local_140,layer,2,-1);
    local_170 = local_140;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != local_128) {
      operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
    }
  }
  bVar5 = Result::good((Result *)local_170);
  if ((bVar5) && (this->ndArrayInterpretation == true)) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Split","");
    this_00 = &this->blobNameToRank;
    validateInputOutputRankEquality((Result *)local_140,layer,&local_c8,this_00);
    local_170 = local_140;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != local_128) {
      operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good((Result *)local_170);
    if (bVar5) {
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Split","");
      validateRankCount((Result *)local_140,layer,(string *)local_a8,3,-1,this_00);
      local_170 = local_140;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_p != local_128) {
        operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      bVar5 = Result::good((Result *)local_170);
      if (bVar5) {
        if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar6 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_a8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_140,pLVar6);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,
                       (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var10 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar7._M_node != p_Var10) {
          if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_140,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar6 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_140,"CHECK failed: (index) < (current_size_): ")
            ;
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar6);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_140);
          }
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_00,(key_type *)
                                ((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
          pRVar2 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
          ppvVar14 = pRVar2->elements;
          if (pRVar2 == (Rep *)0x0) {
            ppvVar14 = (void **)0x0;
          }
          lVar12 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
          bVar5 = lVar12 == 0;
          if (!bVar5) {
            local_144 = *pmVar8;
            lVar13 = 0;
            do {
              __k = *(key_type **)((long)ppvVar14 + lVar13);
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&this_00->_M_t,__k);
              if (((_Rb_tree_header *)iVar7._M_node != p_Var10) &&
                 (pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at(this_00,__k), local_144 != *pmVar8)) {
                local_108._M_string_length = 0;
                local_108.field_2._M_local_buf[0] = '\0';
                psVar3 = (layer->name_).ptr_;
                pcVar4 = (psVar3->_M_dataplus)._M_p;
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_e8,pcVar4,pcVar4 + psVar3->_M_string_length);
                std::operator+(&local_70,"Layer \'",&local_e8);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
                plVar11 = plVar9 + 2;
                if ((long *)*plVar9 == plVar11) {
                  local_40 = *plVar11;
                  lStack_38 = plVar9[3];
                  local_50 = &local_40;
                }
                else {
                  local_40 = *plVar11;
                  local_50 = (long *)*plVar9;
                }
                local_48 = plVar9[1];
                *plVar9 = (long)plVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
                if (local_50 != &local_40) {
                  operator_delete(local_50,local_40 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                           local_108.field_2._M_local_buf[0]) + 1);
                }
                if (!bVar5) goto LAB_0053b795;
                break;
              }
              lVar13 = lVar13 + 8;
              bVar5 = lVar12 * 8 == lVar13;
            } while (!bVar5);
          }
        }
      }
    }
  }
  __return_storage_ptr__->m_type = local_170._0_4_;
  __return_storage_ptr__->m_reason = local_170._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p == &local_158) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_158._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_168._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_160;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_168._M_p = (pointer)&local_158;
LAB_0053b795:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,
                    CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        // between 2 and any number of outputs
        r = validateOutputCount(layer, 2, -1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Split", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Split", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        // check that all outputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.output(0));
        } else {
            return r;
        }

        for (const auto& output : layer.output()) {
            if (blobNameToRank.find(output) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(output)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Split' must have equal ranks for its outputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}